

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitCallRef(PrintExpressionContents *this,CallRef *curr)

{
  ostream *poVar1;
  bool bVar2;
  HeapType type;
  char *pcVar3;
  long lVar4;
  
  bVar2 = printUnreachableOrNullReplacement(this,curr->target);
  if (bVar2) {
    return;
  }
  poVar1 = this->o;
  pcVar3 = "call_ref ";
  bVar2 = curr->isReturn != false;
  if (bVar2) {
    pcVar3 = "return_call_ref ";
  }
  lVar4 = 9;
  if (bVar2) {
    lVar4 = 0x10;
  }
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar4);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  poVar1 = this->o;
  type = wasm::Type::getHeapType(&curr->target->type);
  anon_unknown_217::printHeapType(poVar1,type,this->wasm);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    // TODO: Workaround if target has bottom type.
    if (printUnreachableOrNullReplacement(curr->target)) {
      return;
    }
    printMedium(o, curr->isReturn ? "return_call_ref " : "call_ref ");
    printHeapType(o, curr->target->type.getHeapType(), wasm);
  }